

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__cff_index_get(stbtt__buf b,int i)

{
  byte bVar1;
  stbtt_uint32 sVar2;
  uint uVar3;
  int in_EDX;
  stbtt__buf sVar4;
  int end;
  int start;
  int offsize;
  int count;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  stbtt__buf *in_stack_ffffffffffffffc0;
  stbtt__buf *b_00;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  stbtt__buf local_20 [2];
  
  stbtt__buf_seek(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  sVar2 = stbtt__buf_get((stbtt__buf *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                         ,in_stack_ffffffffffffffcc);
  bVar1 = stbtt__buf_get8(local_20);
  uVar3 = (uint)bVar1;
  if (in_EDX < 0 || (int)sVar2 <= in_EDX) {
    __assert_fail("i >= 0 && i < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                  ,0x4e1,"stbtt__buf stbtt__cff_index_get(stbtt__buf, int)");
  }
  if (uVar3 == 0 || 4 < uVar3) {
    __assert_fail("offsize >= 1 && offsize <= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                  ,0x4e2,"stbtt__buf stbtt__cff_index_get(stbtt__buf, int)");
  }
  b_00 = local_20;
  stbtt__buf_skip(b_00,in_stack_ffffffffffffffbc);
  sVar2 = stbtt__buf_get((stbtt__buf *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
  stbtt__buf_get((stbtt__buf *)CONCAT44(uVar3,sVar2),in_stack_ffffffffffffffcc);
  sVar4 = stbtt__buf_range(b_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  return sVar4;
}

Assistant:

static stbtt__buf stbtt__cff_index_get(stbtt__buf b, int i)
{
   int count, offsize, start, end;
   stbtt__buf_seek(&b, 0);
   count = stbtt__buf_get16(&b);
   offsize = stbtt__buf_get8(&b);
   STBTT_assert(i >= 0 && i < count);
   STBTT_assert(offsize >= 1 && offsize <= 4);
   stbtt__buf_skip(&b, i*offsize);
   start = stbtt__buf_get(&b, offsize);
   end = stbtt__buf_get(&b, offsize);
   return stbtt__buf_range(&b, 2+(count+1)*offsize+start, end - start);
}